

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O1

int fp_r4stat(fitsfile *infptr,int naxis,long *naxes,imgstats *imagestats,int *status)

{
  long lVar1;
  int iVar2;
  void *__ptr;
  long lVar3;
  long lVar4;
  size_t __nmemb;
  long *plVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  float minvalue;
  fitsfile *local_168;
  imgstats *local_160;
  double noise5;
  double noise3;
  double noise2;
  double noise1;
  long ngood;
  int anynul;
  float maxvalue;
  double sigma;
  double mean;
  long lpixel [9];
  long fpixel [9];
  long inc [9];
  
  plVar5 = &DAT_0010a210;
  plVar6 = fpixel;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *plVar6 = *plVar5;
    plVar5 = plVar5 + 1;
    plVar6 = plVar6 + 1;
  }
  plVar5 = &DAT_0010a210;
  plVar6 = lpixel;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *plVar6 = *plVar5;
    plVar5 = plVar5 + 1;
    plVar6 = plVar6 + 1;
  }
  plVar5 = &DAT_0010a210;
  plVar6 = inc;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *plVar6 = *plVar5;
    plVar5 = plVar5 + 1;
    plVar6 = plVar6 + 1;
  }
  lVar3 = *naxes;
  lpixel[0] = (long)(XSAMPLE / 2) + lVar3 / 2;
  fpixel[0] = lVar3 / 2 - (long)(XSAMPLE / 2 + -1);
  if (fpixel[0] < 2) {
    fpixel[0] = 1;
  }
  if (lVar3 <= lpixel[0]) {
    lpixel[0] = lVar3;
  }
  lVar7 = (lpixel[0] - fpixel[0]) + 1;
  lVar3 = fpixel[0];
  lVar8 = lpixel[0];
  if (1 < naxis) {
    lVar1 = naxes[1];
    lVar8 = (long)(YSAMPLE / 2) + lVar1 / 2;
    lVar4 = lVar1 / 2 - (long)(YSAMPLE / 2 + -1);
    lVar3 = 1;
    if (1 < lVar4) {
      lVar3 = lVar4;
    }
    lpixel[1] = lVar8;
    fpixel[1] = lVar3;
    if (lVar1 <= lVar8) {
      lVar8 = lVar1;
      lpixel[1] = lVar1;
    }
  }
  lVar3 = (lVar8 - lVar3) + 1;
  __nmemb = lVar3 * lVar7;
  if (2 < naxis) {
    lpixel[2] = naxes[2] / 2 + 1;
    fpixel[2] = lpixel[2];
  }
  local_168 = infptr;
  local_160 = imagestats;
  __ptr = calloc(__nmemb,4);
  if (__ptr == (void *)0x0) {
    *status = 0x71;
    iVar2 = 0x71;
  }
  else {
    ffgsve(0x8541f136,local_168,0,naxis,naxes,fpixel,lpixel,inc,__ptr,&anynul,status);
    uVar9 = 0x8541f136;
    if (anynul == 0) {
      uVar9 = 0;
    }
    fits_img_stats_float
              (uVar9,__ptr,lVar7,lVar3,anynul != 0,&ngood,&minvalue,&maxvalue,&mean,&sigma,&noise1,
               &noise2,&noise3,&noise5,status);
    local_160->n_nulls = (int)__nmemb - (int)ngood;
    local_160->minval = (double)minvalue;
    local_160->maxval = (double)maxvalue;
    local_160->mean = mean;
    local_160->sigma = sigma;
    local_160->noise1 = noise1;
    local_160->noise2 = noise2;
    local_160->noise3 = noise3;
    local_160->noise5 = noise5;
    free(__ptr);
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int fp_r4stat(fitsfile *infptr, int naxis, long *naxes, imgstats *imagestats, int *status)
{
/*
    read the central XSAMPLE by YSAMPLE region of pixels in the int*2 image, 
    and then compute basic statistics: min, max, mean, sigma, mean diff, etc.
*/

	long fpixel[9] = {1,1,1,1,1,1,1,1,1};
	long lpixel[9] = {1,1,1,1,1,1,1,1,1};
	long inc[9]    = {1,1,1,1,1,1,1,1,1};
	long i1, i2, npix, ngood, nx, ny;
	float *array, minvalue, maxvalue, nullvalue = FLOATNULLVALUE;
	int anynul,checknull = 1;
	double mean, sigma, noise1, noise2, noise3, noise5;
	
         /* select the middle XSAMPLE by YSAMPLE area of the image */
	i1 = naxes[0]/2 - (XSAMPLE/2 - 1);
	i2 = naxes[0]/2 + (XSAMPLE/2);
	if (i1 < 1) i1 = 1;
	if (i2 > naxes[0]) i2 = naxes[0];
	fpixel[0] = i1;
	lpixel[0] = i2;
	nx = i2 - i1 +1;

        if (naxis > 1) {
	    i1 = naxes[1]/2 - (YSAMPLE/2 - 1);
	    i2 = naxes[1]/2 + (YSAMPLE/2);
	    if (i1 < 1) i1 = 1;
	    if (i2 > naxes[1]) i2 = naxes[1];
	    fpixel[1] = i1;
	    lpixel[1] = i2;
	}
	ny = i2 - i1 +1;

	npix = nx * ny;

        /* if there are higher dimensions, read the middle plane of the cube */
	if (naxis > 2) {
	    fpixel[2] = naxes[2]/2 + 1;
	    lpixel[2] = naxes[2]/2 + 1;
	}

	array = calloc(npix, sizeof(float));
	if (!array) {
		*status = MEMORY_ALLOCATION;
		return(*status);
	}

	fits_read_subset_flt(infptr, 0, naxis, naxes, fpixel, lpixel, inc,
	    nullvalue, array, &anynul, status);

	/* are there any null values in the array? */
	if (!anynul) {
	   nullvalue = 0.;
	   checknull = 0;
	}

	/* compute statistics of the image */

        fits_img_stats_float(array, nx, ny, checknull, nullvalue, 
	&ngood, &minvalue, &maxvalue, &mean, &sigma, &noise1, &noise2, &noise3, &noise5, status);

	imagestats->n_nulls = npix - ngood;
	imagestats->minval = minvalue;
	imagestats->maxval = maxvalue; 
	imagestats->mean = mean; 
	imagestats->sigma = sigma; 
	imagestats->noise1 = noise1; 
	imagestats->noise2 = noise2; 
	imagestats->noise3 = noise3; 
	imagestats->noise5 = noise5; 
    
	free(array);
	return(*status);
}